

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_test.cpp
# Opt level: O2

void test_write<io::posix::file&>(file *file)

{
  FILE *__stream;
  ResultBuilder *this;
  SourceLineInfo local_300;
  string read_buf;
  ResultBuilder __catchResult;
  
  Catch::SourceLineInfo::SourceLineInfo
            (&local_300,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/tcbrindle[P]modern-io/test/file_test.cpp"
             ,0x22);
  Catch::ResultBuilder::ResultBuilder
            (&__catchResult,"REQUIRE_NOTHROW",&local_300,
             "io::write(file, io::buffer(test_file_contents))",Normal,"");
  std::__cxx11::string::~string((string *)&local_300);
  local_300.file._M_dataplus._M_p = "The quick brown fox jumps over the lazy dog";
  local_300.file._M_string_length = 0x2b;
  io::net::write<io::posix::file,io::net::const_buffer,io::net::transfer_all,void>(file);
  Catch::ResultBuilder::captureResult(&__catchResult,Ok);
  Catch::ResultBuilder::shouldDebugBreak(&__catchResult);
  Catch::ResultBuilder::react(&__catchResult);
  Catch::ResultBuilder::~ResultBuilder(&__catchResult);
  __stream = fopen("io_test_file.txt","rb");
  read_buf._M_dataplus._M_p = (pointer)&read_buf.field_2;
  std::__cxx11::string::_M_construct((ulong)&read_buf,'+');
  fread(read_buf._M_dataplus._M_p,1,0x2b,__stream);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_300,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/tcbrindle[P]modern-io/test/file_test.cpp"
             ,0x28);
  Catch::ResultBuilder::ResultBuilder
            (&__catchResult,"REQUIRE",&local_300,"test_file_contents == read_buf",Normal,"");
  std::__cxx11::string::~string((string *)&local_300);
  local_300.file._M_string_length = (size_type)&test_file_contents;
  local_300.file._M_dataplus._M_p = (pointer)&__catchResult;
  this = Catch::ExpressionLhs<std::basic_string_view<char,std::char_traits<char>>const&>::
         captureExpression<(Catch::Internal::Operator)0,std::__cxx11::string>
                   ((ExpressionLhs<std::basic_string_view<char,std::char_traits<char>>const&> *)
                    &local_300,&read_buf);
  Catch::ResultBuilder::endExpression(this);
  Catch::ResultBuilder::shouldDebugBreak(&__catchResult);
  Catch::ResultBuilder::react(&__catchResult);
  Catch::ResultBuilder::~ResultBuilder(&__catchResult);
  fclose(__stream);
  std::__cxx11::string::~string((string *)&read_buf);
  return;
}

Assistant:

void test_write(File&& file)
{
    REQUIRE_NOTHROW(io::write(file, io::buffer(test_file_contents)));

    FILE* in_file = std::fopen(test_file_name, "rb");
    std::string read_buf(test_file_contents.size(), '\0');
    std::fread(&*read_buf.begin(), 1, test_file_contents.size(), in_file);

    REQUIRE(test_file_contents == read_buf);

    std::fclose(in_file);
}